

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalRef.hpp
# Opt level: O1

void __thiscall BCL::GlobalRef<int>::GlobalRef(GlobalRef<int> *this,GlobalPtr<int> ptr)

{
  debug_error *this_00;
  string local_40;
  
  (this->ptr_).rank = ptr.rank;
  (this->ptr_).ptr = ptr.ptr;
  if (ptr.rank != 0 || ptr.ptr != 0) {
    return;
  }
  this_00 = (debug_error *)__cxa_allocate_exception(0x40);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"GlobalRef() constructor created a null reference.","");
  debug_error::debug_error(this_00,&local_40);
  __cxa_throw(this_00,&debug_error::typeinfo,debug_error::~debug_error);
}

Assistant:

GlobalRef(BCL::GlobalPtr<T> ptr) : ptr_(ptr) {
    BCL_DEBUG(
      if (ptr_ == nullptr) {
        throw debug_error("GlobalRef() constructor created a null reference.");
      }
    )
  }